

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_dophase_done(connectdata *conn,_Bool connected)

{
  int *piVar1;
  
  piVar1 = (int *)(conn->data->req).protop;
  if (*piVar1 != 0) {
    piVar1 = (int *)0x0;
    Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
  }
  return (CURLcode)piVar1;
}

Assistant:

static CURLcode smtp_dophase_done(struct connectdata *conn, bool connected)
{
  struct SMTP *smtp = conn->data->req.protop;

  (void)connected;

  if(smtp->transfer != FTPTRANSFER_BODY)
    /* no data to transfer */
    Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

  return CURLE_OK;
}